

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_tcp_storage.h
# Opt level: O2

shared_ptr<cppcms::sessions::session_storage> __thiscall
cppcms::sessions::tcp_factory::get(tcp_factory *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<cppcms::sessions::session_storage> sVar1;
  
  std::__shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2> *)
             (in_RSI + 8));
  sVar1.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppcms::sessions::session_storage>)
         sVar1.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual booster::shared_ptr<session_storage> get() 
	{
		return storage_;
	}